

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void c4::afree(void *ptr)

{
  code *pcVar1;
  bool bVar2;
  
  if (detail::s_afree != (undefined *)0x0) {
    (*(code *)detail::s_afree)(ptr);
    return;
  }
  if (((byte)s_error_flags & 1) != 0) {
    bVar2 = is_debugger_attached();
    if (bVar2) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
  }
  handle_error(0x1f94de,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x441f);
}

Assistant:

void afree(void* ptr)
{
    C4_ASSERT_MSG(c4::get_afree() != nullptr, "did you forget to call set_afree()?");
    auto fn = c4::get_afree();
    fn(ptr);
}